

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

void Abc_ZddManCreatePerms(Abc_ZddMan *p,int nPermSize)

{
  int *piVar1;
  int local_20;
  int local_1c;
  int v;
  int j;
  int i;
  int nPermSize_local;
  Abc_ZddMan *p_local;
  
  local_20 = 0;
  if (p->nVars << 1 != nPermSize * (nPermSize + -1)) {
    __assert_fail("2 * p->nVars == nPermSize * (nPermSize - 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                  ,0xd4,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
  }
  if (p->nPermSize != 0) {
    __assert_fail("p->nPermSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                  ,0xd5,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
  }
  p->nPermSize = nPermSize;
  piVar1 = (int *)malloc((long)p->nVars << 2);
  memset(piVar1,0xff,(long)p->nVars << 2);
  p->pV2TI = piVar1;
  piVar1 = (int *)malloc((long)p->nVars << 2);
  memset(piVar1,0xff,(long)p->nVars << 2);
  p->pV2TJ = piVar1;
  piVar1 = (int *)malloc((long)(p->nPermSize * p->nPermSize) << 2);
  memset(piVar1,0xff,(long)(p->nPermSize * p->nPermSize) << 2);
  p->pT2V = piVar1;
  for (v = 0; local_1c = v, v < nPermSize; v = v + 1) {
    while (local_1c = local_1c + 1, local_1c < nPermSize) {
      p->pV2TI[local_20] = v;
      p->pV2TJ[local_20] = local_1c;
      Abc_ZddSetVarIJ(p,v,local_1c,local_20);
      local_20 = local_20 + 1;
    }
  }
  if (local_20 != p->nVars) {
    __assert_fail("v == p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                  ,0xe1,"void Abc_ZddManCreatePerms(Abc_ZddMan *, int)");
  }
  return;
}

Assistant:

void Abc_ZddManCreatePerms( Abc_ZddMan * p, int nPermSize )
{
    int i, j, v = 0;
    assert( 2 * p->nVars == nPermSize * (nPermSize - 1) );
    assert( p->nPermSize == 0 );
    p->nPermSize = nPermSize;
    p->pV2TI = ABC_FALLOC( int, p->nVars );
    p->pV2TJ = ABC_FALLOC( int, p->nVars );
    p->pT2V  = ABC_FALLOC( int, p->nPermSize * p->nPermSize );
    for ( i = 0; i < nPermSize; i++ )
        for ( j = i + 1; j < nPermSize; j++ )
        {
            p->pV2TI[v] = i;
            p->pV2TJ[v] = j;
            Abc_ZddSetVarIJ( p, i, j, v++ );
        }
    assert( v == p->nVars );
}